

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O0

void menu_bar_inter_abort_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object sub_window;
  Am_Object local_20;
  Am_Object menu_bar_win;
  Am_Object obj;
  Am_Object *inter_local;
  
  Am_Object::Am_Object(&menu_bar_win);
  Am_Object::Am_Object(&local_20);
  Am_Object::Am_Object(&local_38);
  Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)inter);
  pAVar2 = Am_Object::Get(&local_40,0x68,0);
  Am_Object::operator=(&local_20,pAVar2);
  Am_Object::~Am_Object(&local_40);
  pAVar2 = Am_Object::Get(inter,0x16b,0);
  Am_Object::operator=(&menu_bar_win,pAVar2);
  Am_Object::Am_Object(&local_50,&menu_bar_win);
  Am_Object::Am_Object(&local_58,&local_20);
  clear_interim_sel(&local_48,&local_50);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::operator=(&menu_bar_win,pAVar2);
  Am_Object::Am_Object(&local_68,&menu_bar_win);
  Am_Object::Am_Object(&local_70,&local_20);
  clear_interim_sel(&local_60,&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  pAVar2 = Am_Object::Get(inter,0x1d2,0);
  Am_Object::operator=(&local_38,pAVar2);
  bVar1 = Am_Object::Valid(&local_38);
  if (bVar1) {
    set_sub_window_vis(&local_38,false,&local_20);
  }
  value = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  Am_Object::Set(inter,0x1d2,value,1);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&menu_bar_win);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, menu_bar_inter_abort,
                 (Am_Object inter))
{
  Am_Object obj, menu_bar_win, sub_window;
  menu_bar_win = inter.Get_Owner().Get(Am_WINDOW);
  obj = inter.Get(Am_OLD_INTERIM_VALUE);
  clear_interim_sel(obj, menu_bar_win);
  obj = inter.Get(Am_INTERIM_VALUE);
  clear_interim_sel(obj, menu_bar_win);
  // now make sub_window go away
  sub_window = inter.Get(Am_SUB_MENU);
  if (sub_window.Valid())
    set_sub_window_vis(sub_window, false, menu_bar_win);
  inter.Set(Am_SUB_MENU, Am_No_Object, Am_OK_IF_NOT_THERE);
}